

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O1

iterator __thiscall
GF2::MI<45ul,GF2::MOGrlex<45ul>>::Insert<45ul,GF2::MOGrlex<45ul>>
          (MI<45ul,GF2::MOGrlex<45ul>> *this,MP<45UL,_GF2::MOGrlex<45UL>_> *polyRight)

{
  bool bVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  iterator pos;
  iterator local_58;
  _List_node_base local_50;
  _List_node_base *local_40;
  
  local_58._M_node = (_List_node_base *)0x0;
  bVar1 = MI<45UL,_GF2::MOGrlex<45UL>_>::Find
                    ((MI<45UL,_GF2::MOGrlex<45UL>_> *)this,polyRight,&local_58);
  if (!bVar1) {
    local_40 = (_List_node_base *)0x0;
    local_50._M_next = &local_50;
    local_50._M_prev = &local_50;
    p_Var2 = (_List_node_base *)operator_new(0x30);
    p_Var3 = p_Var2 + 1;
    p_Var2[1]._M_next = local_50._M_next;
    p_Var2[1]._M_prev = local_50._M_prev;
    p_Var2[2]._M_next = local_40;
    if (local_50._M_next == &local_50) {
      p_Var2[1]._M_prev = p_Var3;
      p_Var2[1]._M_next = p_Var3;
    }
    else {
      (local_50._M_prev)->_M_next = p_Var3;
      p_Var3->_M_next->_M_prev = p_Var3;
      local_40 = (_List_node_base *)0x0;
      local_50._M_next = &local_50;
      local_50._M_prev = &local_50;
    }
    std::__detail::_List_node_base::_M_hook(p_Var2);
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    local_58._M_node = p_Var2;
    p_Var2 = local_50._M_next;
    if (p_Var3 != (_List_node_base *)polyRight) {
      std::__cxx11::list<GF2::MM<45ul>,std::allocator<GF2::MM<45ul>>>::
      _M_assign_dispatch<std::_List_const_iterator<GF2::MM<45ul>>>
                ((list<GF2::MM<45ul>,std::allocator<GF2::MM<45ul>>> *)p_Var3,
                 (polyRight->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>).
                 super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
                 super__List_node_base._M_next,polyRight);
      p_Var2 = local_50._M_next;
    }
    while (p_Var2 != &local_50) {
      p_Var3 = p_Var2->_M_next;
      operator_delete(p_Var2,0x18);
      p_Var2 = p_Var3;
    }
  }
  return (iterator)local_58._M_node;
}

Assistant:

iterator Insert(const MP<_m, _O1>& polyRight)
	{	
		assert(!polyRight.IsEmpty());
		iterator pos;
		if (!Find(polyRight, pos))
			*(pos = insert(pos, MP<_n, _O>(_order))) = polyRight;
		return pos;
	}